

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::ShaderGLImpl::GetCompileStatus
          (ShaderGLImpl *this,IDataBlob **ppCompilerOutput,bool ThrowOnError)

{
  undefined *puVar1;
  PFNGLGETSHADERINFOLOGPROC p_Var2;
  PFNGLGETSHADERIVPROC p_Var3;
  GLint GVar4;
  bool bVar5;
  GLuint GVar6;
  char *pcVar7;
  Char *Message;
  long lVar8;
  long lVar9;
  DataBlobImpl *pDVar10;
  char *__src;
  void *__src_00;
  ostream *poVar11;
  undefined8 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  char (*in_R8) [35];
  Diligent local_2c8 [32];
  undefined1 local_2a8 [8];
  string _msg_2;
  undefined1 local_268 [8];
  string _msg_1;
  undefined1 local_228 [8];
  string _msg;
  stringstream ss;
  ostream local_1f8 [376];
  char *local_80;
  char *DataPtr;
  RefCntAutoPtr<Diligent::DataBlobImpl> pOutputDataBlob;
  string msg;
  int CharsWritten;
  GLint local_3c;
  undefined1 local_38 [4];
  int InfoLogLen;
  vector<char,_std::allocator<char>_> InfoLog;
  GLint compiled;
  bool ThrowOnError_local;
  IDataBlob **ppCompilerOutput_local;
  ShaderGLImpl *this_local;
  
  p_Var3 = __glewGetShaderiv;
  InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
  InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = ThrowOnError;
  GVar6 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                    ((GLObjWrapper *)&this->m_GLShaderObj);
  (*p_Var3)(GVar6,0x8b81,
            (GLint *)&InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_38);
  p_Var3 = __glewGetShaderiv;
  local_3c = 0;
  GVar6 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                    ((GLObjWrapper *)&this->m_GLShaderObj);
  (*p_Var3)(GVar6,0x8b84,&local_3c);
  if (0 < local_3c) {
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_38,(long)local_3c);
    p_Var2 = __glewGetShaderInfoLog;
    msg.field_2._8_4_ = 0;
    GVar6 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int
                      ((GLObjWrapper *)&this->m_GLShaderObj);
    GVar4 = local_3c;
    pcVar7 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_38);
    (*p_Var2)(GVar6,GVar4,(GLsizei *)(msg.field_2._M_local_buf + 8),pcVar7);
    if (msg.field_2._8_4_ != local_3c + -1) {
      FormatString<char[27]>((string *)&pOutputDataBlob,(char (*) [27])"Unexpected info log length")
      ;
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetCompileStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                 ,0x13d);
      std::__cxx11::string::~string((string *)&pOutputDataBlob);
    }
    if (ppCompilerOutput != (IDataBlob **)0x0) {
      lVar8 = (long)local_3c;
      lVar9 = std::__cxx11::string::length();
      DataBlobImpl::Create((DataBlobImpl *)&DataPtr,lVar8 + 1 + lVar9,(void *)0x0);
      pDVar10 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                          ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&DataPtr);
      local_80 = DataBlobImpl::GetDataPtr<char>(pDVar10,0);
      bVar5 = std::vector<char,_std::allocator<char>_>::empty
                        ((vector<char,_std::allocator<char>_> *)local_38);
      pcVar7 = local_80;
      if (!bVar5) {
        __src = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)local_38);
        memcpy(pcVar7,__src,(long)local_3c);
      }
      pcVar7 = local_80 + local_3c;
      __src_00 = (void *)std::__cxx11::string::data();
      lVar8 = std::__cxx11::string::length();
      memcpy(pcVar7,__src_00,lVar8 + 1);
      pDVar10 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                          ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&DataPtr);
      DataBlobImpl::QueryInterface
                (pDVar10,(INTERFACE_ID *)IID_DataBlob,(IObject **)ppCompilerOutput);
      RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&DataPtr);
    }
  }
  if ((InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ == 0) ||
     (bVar5 = std::vector<char,_std::allocator<char>_>::empty
                        ((vector<char,_std::allocator<char>_> *)local_38), !bVar5)) {
    std::__cxx11::stringstream::stringstream((stringstream *)(_msg.field_2._M_local_buf + 8));
    pcVar7 = "Failed to compile shader \'";
    if (InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ != 0) {
      pcVar7 = "Compiler output for shader \'";
    }
    poVar11 = std::operator<<(local_1f8,pcVar7);
    poVar11 = std::operator<<(poVar11,(this->super_ShaderBase<Diligent::EngineGLImplTraits>).
                                      super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                                      .m_Desc.super_DeviceObjectAttribs.Name);
    std::operator<<(poVar11,"\'");
    bVar5 = std::vector<char,_std::allocator<char>_>::empty
                      ((vector<char,_std::allocator<char>_> *)local_38);
    if (bVar5) {
      if (InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ == 0) {
        std::operator<<(local_1f8," (no shader log available).");
      }
    }
    else {
      poVar11 = std::operator<<(local_1f8,":");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      pcVar7 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_38);
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)local_38);
      std::ostream::write((char *)local_1f8,(long)pcVar7);
    }
    if (InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ == 0) {
      if (ppCompilerOutput == (IDataBlob **)0x0) {
        FormatString<char[62],std::__cxx11::string,char[35]>
                  ((string *)local_268,
                   (Diligent *)"Failed shader full source: \n\n>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n",
                   (char (*) [62])&this->m_GLSLSourceString,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\n<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<\n\n",in_R8);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar12 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(0,uVar12,0);
        }
        std::__cxx11::string::~string((string *)local_268);
      }
      if ((InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ & 1) == 0) {
        std::__cxx11::stringstream::str();
        FormatString<std::__cxx11::string>((string *)local_2a8,local_2c8,Args_00);
        std::__cxx11::string::~string((string *)local_2c8);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar12 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar12,0);
        }
        std::__cxx11::string::~string((string *)local_2a8);
      }
      else {
        std::__cxx11::stringstream::str();
        LogError<true,std::__cxx11::string>
                  (false,"GetCompileStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderGLImpl.cpp"
                   ,0x171,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&_msg_2.field_2 + 8));
        std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
      }
    }
    else {
      std::__cxx11::stringstream::str();
      FormatString<std::__cxx11::string>
                ((string *)local_228,(Diligent *)(_msg_1.field_2._M_local_buf + 8),Args);
      std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar12 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(0,uVar12,0);
      }
      std::__cxx11::string::~string((string *)local_228);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)(_msg.field_2._M_local_buf + 8));
  }
  bVar5 = InfoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ != 0;
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return bVar5;
}

Assistant:

bool ShaderGLImpl::GetCompileStatus(IDataBlob** ppCompilerOutput, bool ThrowOnError) noexcept(false)
{
    GLint compiled = GL_FALSE;
    // Get compilation status
    glGetShaderiv(m_GLShaderObj, GL_COMPILE_STATUS, &compiled);

    std::vector<GLchar> InfoLog;
    {
        int InfoLogLen = 0;
        // The function glGetShaderiv() tells how many bytes to allocate; the length includes the NULL terminator.
        glGetShaderiv(m_GLShaderObj, GL_INFO_LOG_LENGTH, &InfoLogLen);

        if (InfoLogLen > 0)
        {
            InfoLog.resize(InfoLogLen);

            int CharsWritten = 0;
            // Get the log. InfoLogLen is the size of InfoLog. This tells OpenGL how many bytes at maximum it will write
            // charsWritten is a return value, specifying how many bytes it actually wrote. One may pass NULL if he
            // doesn't care
            glGetShaderInfoLog(m_GLShaderObj, InfoLogLen, &CharsWritten, InfoLog.data());
            VERIFY(CharsWritten == InfoLogLen - 1, "Unexpected info log length");

            if (ppCompilerOutput != nullptr)
            {
                // InfoLogLen accounts for null terminator
                auto pOutputDataBlob = DataBlobImpl::Create(InfoLogLen + m_GLSLSourceString.length() + 1);

                char* DataPtr = pOutputDataBlob->GetDataPtr<char>();
                if (!InfoLog.empty())
                {
                    // Copy info log including null terminator
                    memcpy(DataPtr, InfoLog.data(), InfoLogLen);
                }
                // Copy source code including null terminator
                memcpy(DataPtr + InfoLogLen, m_GLSLSourceString.data(), m_GLSLSourceString.length() + 1);

                pOutputDataBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppCompilerOutput));
            }
        }
    }

    if (!compiled || !InfoLog.empty())
    {
        std::stringstream ss;
        ss << (compiled ? "Compiler output for shader '" : "Failed to compile shader '") << m_Desc.Name << "'";

        if (!InfoLog.empty())
        {
            ss << ":" << std::endl;
            ss.write(InfoLog.data(), InfoLog.size() - 1);
        }
        else if (!compiled)
        {
            ss << " (no shader log available).";
        }

        if (compiled)
        {
            LOG_INFO_MESSAGE(ss.str());
        }
        else
        {
            if (ppCompilerOutput == nullptr)
            {
                // Dump full source code to debug output
                LOG_INFO_MESSAGE("Failed shader full source: \n\n>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>>\n",
                                 m_GLSLSourceString,
                                 "\n<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<<\n\n");
            }

            if (ThrowOnError)
            {
                LOG_ERROR_AND_THROW(ss.str());
            }
            else
            {
                LOG_ERROR_MESSAGE(ss.str());
            }
        }
    }

    return compiled != GL_FALSE;
}